

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

void __thiscall
cmServerRequest::cmServerRequest
          (cmServerRequest *this,cmServer *server,cmConnection *connection,string *t,string *c,
          Value *d)

{
  std::__cxx11::string::string((string *)this,(string *)t);
  std::__cxx11::string::string((string *)&this->Cookie,(string *)c);
  Json::Value::Value(&this->Data,d);
  this->Connection = connection;
  this->m_Server = server;
  return;
}

Assistant:

cmServerRequest::cmServerRequest(cmServer* server, cmConnection* connection,
                                 std::string t, std::string c, Json::Value d)
  : Type(std::move(t))
  , Cookie(std::move(c))
  , Data(std::move(d))
  , Connection(connection)
  , m_Server(server)
{
}